

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::outerBounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  Edge *pEVar2;
  QPodPoint *pQVar3;
  Node *pNVar4;
  Node *pNVar5;
  long lVar6;
  long lVar7;
  Node *pNVar8;
  Node *pNVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar13;
  
  pNVar8 = (this->m_edgeList).root;
  if (pNVar8 == (Node *)0x0) {
    return (pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*>)ZEXT816(0);
  }
  pEVar2 = (this->m_edges).buffer;
  pQVar3 = (this->m_parent->m_vertices).buffer;
  lVar7 = (long)point->x;
  lVar6 = (long)point->y;
  pNVar4 = (Node *)0x0;
  pNVar5 = (Node *)0x0;
  while( true ) {
    iVar1 = pNVar8->data;
    lVar11 = (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y);
    lVar10 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x);
    if (lVar10 - lVar11 == 0) break;
    pNVar9 = pNVar8;
    if (lVar11 <= lVar10) {
      pNVar4 = pNVar8;
      pNVar9 = pNVar5;
    }
    pNVar5 = pNVar9;
    pNVar8 = (&pNVar8->left)[lVar11 <= lVar10];
    if (pNVar8 == (Node *)0x0) goto LAB_004486d4;
  }
  for (pNVar9 = pNVar8->left; pNVar9 != (Node *)0x0; pNVar9 = (&pNVar9->left)[bVar12]) {
    iVar1 = pNVar9->data;
    bVar12 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
             (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) != 0;
    if (bVar12) {
      pNVar4 = pNVar9;
    }
  }
  for (pNVar8 = pNVar8->right; pNVar8 != (Node *)0x0; pNVar8 = (&pNVar8->left)[bVar12]) {
    iVar1 = pNVar8->data;
    bVar12 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
             (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) == 0;
    if (!bVar12) {
      pNVar5 = pNVar8;
    }
  }
LAB_004486d4:
  pVar13.second = pNVar5;
  pVar13.first = pNVar4;
  return pVar13;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::outerBounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);

    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0)
            break;
        if (d < 0) {
            result.second = current;
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    if (!current)
        return result;

    QRBTree<int>::Node *mid = current;

    current = mid->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    current = mid->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            current = current->right;
        } else {
            result.second = current;
            current = current->left;
        }
    }

    return result;
}